

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

bool __thiscall Tokenizer::tryToSkipSpaces(Tokenizer *this)

{
  char cVar1;
  int iVar2;
  bool result;
  undefined7 in_stack_fffffffffffffff0;
  byte bVar3;
  
  bVar3 = 0;
  while( true ) {
    cVar1 = Stream::peek((Stream *)0x193460);
    iVar2 = isspace((int)cVar1);
    if (iVar2 == 0) break;
    bVar3 = 1;
    Stream::advance((Stream *)CONCAT17(1,in_stack_fffffffffffffff0));
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool Tokenizer::tryToSkipSpaces()
{
  bool result = false;
  while(isspace(stream_.peek()))
  {
    result = true;
    stream_.advance();
  }

  return result;
}